

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImmutableList.cpp
# Opt level: O0

void __thiscall
regex::ImmutableStringBuilder<8>::AppendWithCopy(ImmutableStringBuilder<8> *this,LPCWSTR str)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  Memory *this_00;
  HeapAllocator *alloc;
  AllocatedStringChunk *this_01;
  TrackAllocData local_90;
  AllocatedStringChunk *local_68;
  AllocatedStringChunk *newAllocatedString;
  undefined8 local_58;
  TrackAllocData local_50;
  char16_t *local_28;
  WCHAR *buffer;
  size_t strLength;
  LPCWSTR str_local;
  ImmutableStringBuilder<8> *this_local;
  
  strLength = (size_t)str;
  str_local = (LPCWSTR)this;
  if (str == (LPCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
                       ,0x32,"(str != nullptr)","str != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sVar4 = PAL_wcslen((char16_t *)strLength);
  buffer = (WCHAR *)(sVar4 + 1);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&char16_t::typeinfo,0,(size_t)buffer,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
             ,0x35);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  newAllocatedString = (AllocatedStringChunk *)Memory::HeapAllocator::NoThrowAlloc;
  local_58 = 0;
  local_28 = Memory::AllocateArray<Memory::HeapAllocator,char16_t,true>
                       (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,
                        (size_t)buffer);
  if (local_28 == (char16_t *)0x0) {
    Js::Throw::OutOfMemory();
  }
  wcsncpy_s(local_28,(size_t)buffer,(WCHAR *)strLength,(size_t)buffer);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&AllocatedStringChunk::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ImmutableList.cpp"
             ,0x3a);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_90);
  this_01 = (AllocatedStringChunk *)new<Memory::HeapAllocator>(0x10,alloc,true,0x469be0);
  AllocatedStringChunk::AllocatedStringChunk(this_01);
  local_68 = this_01;
  if (this_01 == (AllocatedStringChunk *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,char16_t>
              (&Memory::HeapAllocator::Instance,(size_t)buffer,local_28);
    Js::Throw::OutOfMemory();
  }
  this_01->dataPtr = local_28;
  this_01->next = *(AllocatedStringChunk **)(this + 0x20);
  *(AllocatedStringChunk **)(this + 0x20) = this_01;
  Append(this,local_28);
  return;
}

Assistant:

void regex::ImmutableStringBuilder<chunkSize>::AppendWithCopy(_In_z_ LPCWSTR str)
{
    AssertMsg(str != nullptr, "str != nullptr");
    size_t strLength = wcslen(str) + 1; // include null-terminated

    WCHAR* buffer = HeapNewNoThrowArray(WCHAR, strLength);
    IfNullThrowOutOfMemory(buffer);
    wcsncpy_s(buffer, strLength, str, strLength);

    // append in front of the tracked allocated strings
    AllocatedStringChunk* newAllocatedString = HeapNewNoThrow(AllocatedStringChunk);
    if (newAllocatedString == nullptr)
    {
        // cleanup
        HeapDeleteArray(strLength, buffer);
        Js::Throw::OutOfMemory();
    }

    newAllocatedString->dataPtr = buffer;
    newAllocatedString->next = this->allocatedStringChunksHead;
    this->allocatedStringChunksHead = newAllocatedString;

    // append to the stringBuilder string
    this->Append(buffer);
}